

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void arm_tr_translate_insn(DisasContextBase *dcbase,CPUState *cpu)

{
  CPUArchState_conflict1 *env;
  abi_ptr addr;
  target_ulong tVar1;
  TCGContext_conflict1 *tcg_ctx;
  arg_SB *addr_00;
  ulong uVar2;
  _Bool _Var3;
  int iVar4;
  DisasJumpType DVar5;
  DisasJumpType insn;
  arg_SB *a;
  uint32_t target_el;
  uint uVar6;
  arg_CPS local_40;
  
  env = (CPUArchState_conflict1 *)cpu->env_ptr;
  _Var3 = arm_pre_translate_insn((DisasContext_conflict1 *)dcbase);
  if (_Var3) {
    return;
  }
  iVar4 = uc_addr_is_exit((uc_struct *)dcbase[8].pc_next,dcbase->pc_next);
  if (iVar4 != 0) {
LAB_005dba2b:
    dcbase->is_jmp = DISAS_TARGET_2;
    return;
  }
  addr = dcbase->pc_next;
  dcbase[1].pc_first = addr;
  iVar4 = *(int *)((long)&dcbase[2].pc_first + 4);
  DVar5 = cpu_ldl_code_aarch64(env,addr);
  insn = DVar5 >> 0x18 | (DVar5 & 0xff0000) >> 8 | (DVar5 & 0xff00) << 8 | DVar5 << 0x18;
  if (iVar4 == 0) {
    insn = DVar5;
  }
  dcbase[1].is_jmp = insn;
  tVar1 = dcbase[8].pc_next;
  if (*(int *)(tVar1 + 0x578) != 0) goto LAB_005dba2b;
  dcbase->pc_next = dcbase->pc_next + 4;
  if ((dcbase[4].pc_first & 0x200) != 0) {
    if ((dcbase[2].is_jmp == 0x17) && (*(char *)((long)&dcbase[3].tb + 4) != '\0')) {
      target_el = 3;
    }
    else {
      target_el = 1;
      if (1 < dcbase[3].max_insns) {
        target_el = dcbase[3].max_insns;
      }
    }
    gen_exception_insn((DisasContext_conflict1 *)dcbase,(uint32_t)dcbase[1].pc_first,0x12,0x2000000,
                       target_el);
    goto LAB_005dbbf8;
  }
  uVar6 = insn >> 0x1c;
  tcg_ctx = *(TCGContext_conflict1 **)(tVar1 + 0x2e8);
  addr_00 = (arg_SB *)dcbase[1].pc_first;
  a = addr_00;
  _Var3 = _hook_exists_bounded(*(list_item **)(tVar1 + 0x358),(uint64_t)addr_00);
  if (_Var3) {
    gen_set_pc_im((DisasContext_conflict1 *)dcbase,(target_ulong)addr_00);
    a = (arg_SB *)0x4;
    gen_uc_tracecode(tcg_ctx,4,2,(void *)dcbase[8].pc_next,dcbase[1].pc_first);
    check_exit_request_aarch64(tcg_ctx);
  }
  if (uVar6 == 0xe) {
LAB_005dbba8:
    _Var3 = disas_a32((DisasContext_conflict1 *)dcbase,insn);
    if ((_Var3) || (_Var3 = disas_vfp((DisasContext_conflict1 *)dcbase,insn), _Var3))
    goto LAB_005dbbf8;
    if (((insn & 0xe00) == 0xa00) || ((insn >> 0x18 & 0xf) - 0xf < 0xfffffffd)) goto LAB_005dbbf0;
    iVar4 = disas_coproc_insn((DisasContext_conflict1 *)dcbase,insn);
    goto LAB_005dbbec;
  }
  if (uVar6 != 0xf) {
    arm_skip_unless((DisasContext_conflict1 *)dcbase,uVar6);
    goto LAB_005dbba8;
  }
  uVar2 = dcbase[4].pc_first;
  if (-1 < (short)uVar2) goto LAB_005dbbf0;
  switch(insn >> 0x19) {
  case 0x78:
    if ((insn & 0x1f1fc20) == 0x1010000) {
      local_40.A = insn >> 9 & DISAS_TOO_MANY;
      if ((insn & 0xe01df) == DISAS_NEXT) {
        _Var3 = trans_SETEND((DisasContext_conflict1 *)dcbase,(arg_SETEND *)&local_40);
        goto LAB_005dbcf5;
      }
    }
    else if ((insn & 0x1f1fc20) == 0x1000000) {
      local_40.imod = insn >> 0x12 & 3;
      local_40.M = insn >> 0x11 & 1;
      local_40.A = insn >> 8 & DISAS_TOO_MANY;
      local_40.I = insn >> 7 & 1;
      local_40.F = insn >> 6 & 1;
      local_40.mode = insn & 0x1f;
      if ((insn >> 9 & 1) == 0) {
        _Var3 = trans_CPS((DisasContext_conflict1 *)dcbase,&local_40);
        goto LAB_005dbcf5;
      }
    }
    break;
  case 0x7a:
    uVar6 = (insn & 0x1700000) - 0x100000;
    switch(uVar6 * 0x800 | uVar6 >> 0x15) {
    case 0:
switchD_005dbc34_caseD_0:
      if (((uint)uVar2 >> 0xc & 1) != 0) goto LAB_005dbbf8;
      break;
    case 2:
switchD_005dbc34_caseD_1:
      if (((~insn & 0xf000) == 0) && ((uVar2 & 0x20) != 0)) goto LAB_005dbbf8;
      break;
    case 8:
switchD_005dbc34_caseD_4:
      if ((~insn & 0xf000) == 0) goto switchD_005dbc34_caseD_0;
      break;
    case 10:
switchD_005dbc34_caseD_5:
      if ((~insn & 0xf000) == 0) goto LAB_005dbbf8;
      break;
    case 0xb:
      switch((insn & 0x8ffff0) - 0xff010 >> 4) {
      case DISAS_NEXT:
        if ((~insn & 0xf) == 0) {
          _Var3 = trans_CLREX((DisasContext_conflict1 *)dcbase,a);
          goto LAB_005dbcf5;
        }
        break;
      case DISAS_TARGET_0:
      case DISAS_TARGET_1:
        _Var3 = trans_DSB((DisasContext_conflict1 *)dcbase,a);
        goto LAB_005dbcf5;
      case DISAS_TARGET_2:
        _Var3 = trans_ISB((DisasContext_conflict1 *)dcbase,a);
LAB_005dbcf5:
        if (_Var3 != false) goto LAB_005dbbf8;
        break;
      case DISAS_TARGET_3:
        if ((insn & (DISAS_TARGET_11|DISAS_TOO_MANY)) == DISAS_NEXT) {
          _Var3 = trans_SB((DisasContext_conflict1 *)dcbase,a);
          goto LAB_005dbcf5;
        }
      }
    }
    break;
  case 0x7b:
    uVar6 = (insn & 0x1700010) - 0x100000;
    switch(uVar6 * 0x400 | uVar6 >> 0x16) {
    case 0:
      goto switchD_005dbc34_caseD_0;
    case 1:
      goto switchD_005dbc34_caseD_1;
    case 4:
      goto switchD_005dbc34_caseD_4;
    case 5:
      goto switchD_005dbc34_caseD_5;
    }
    break;
  case 0x7c:
    if ((insn & 0x50ffe0) == 0x400500) {
      local_40.F = insn >> 0x17 & 3;
      local_40.I = insn >> 0x15 & 1;
      local_40.A = insn & 0x1f;
      if ((insn & 0xf0000) == 0xd0000) {
        _Var3 = trans_SRS((DisasContext_conflict1 *)dcbase,(arg_SRS *)&local_40);
        goto LAB_005dbcf5;
      }
    }
    else if ((insn & 0x50ffe0) == 0x100a00) {
      local_40.A = insn >> 0x17 & DISAS_TARGET_0;
      local_40.I = insn >> 0x15 & 1;
      local_40.F = insn >> 0x10 & 0xf;
      if ((insn & 0x1f) == DISAS_NEXT) {
        _Var3 = trans_RFE((DisasContext_conflict1 *)dcbase,(arg_RFE *)&local_40);
        goto LAB_005dbcf5;
      }
    }
    break;
  case 0x7d:
    local_40.A = ((int)(insn << 8) >> 7 | insn >> 0x18 & 1) * 2;
    _Var3 = trans_BLX_i((DisasContext_conflict1 *)dcbase,(arg_BLX_i *)&local_40);
    goto LAB_005dbcf5;
  }
  _Var3 = disas_vfp_uncond((DisasContext_conflict1 *)dcbase,insn);
  if (_Var3) goto LAB_005dbbf8;
  if ((insn & 0xe000000) == 0x2000000) {
    if ((dcbase[4].pc_first & 0x100) != 0) {
      iVar4 = disas_neon_data_insn((DisasContext_conflict1 *)dcbase,insn);
      goto LAB_005dbbec;
    }
  }
  else {
    if ((insn & 0xf100000) == 0x4000000) {
      if ((dcbase[4].pc_first & 0x100) == 0) goto LAB_005dbbf0;
      iVar4 = disas_neon_ls_insn((DisasContext_conflict1 *)dcbase,insn);
    }
    else if ((insn & 0xe000f00) == 0xc000100) {
      if (((dcbase[4].pc_first & 4) == 0) || ((dcbase[4].num_insns & 2) == 0)) goto LAB_005dbbf0;
      iVar4 = disas_iwmmxt_insn((DisasContext_conflict1 *)dcbase,insn);
    }
    else if (((insn & 0xe000a00) == 0xc000800) && ((dcbase[4].pc_first & 0x8000000) != 0)) {
      iVar4 = disas_neon_insn_3same_ext((DisasContext_conflict1 *)dcbase,insn);
    }
    else {
      if (((insn & 0xf000a00) != 0xe000800) || ((dcbase[4].pc_first & 0x8000000) == 0))
      goto LAB_005dbbf0;
      iVar4 = disas_neon_insn_2reg_scalar_ext((DisasContext_conflict1 *)dcbase,insn);
    }
LAB_005dbbec:
    if (iVar4 == 0) goto LAB_005dbbf8;
  }
LAB_005dbbf0:
  unallocated_encoding_aarch64((DisasContext_conflict1 *)dcbase);
LAB_005dbbf8:
  arm_post_translate_insn((DisasContext_conflict1 *)dcbase);
  return;
}

Assistant:

static void arm_tr_translate_insn(DisasContextBase *dcbase, CPUState *cpu)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);
    CPUARMState *env = cpu->env_ptr;
    unsigned int insn;

    if (arm_pre_translate_insn(dc)) {
        return;
    }

    // Unicorn: end address tells us to stop emulation
    if (uc_addr_is_exit(dc->uc, dcbase->pc_next)) {
        // imitate WFI instruction to halt emulation
        dcbase->is_jmp = DISAS_WFI;
    } else {
        dc->pc_curr = dc->base.pc_next;
        insn = arm_ldl_code(env, dc->base.pc_next, dc->sctlr_b);
        dc->insn = insn;

        // Unicorn:
        //
        // If we get an error during fetching code, we have to skip the instruction decoding
        // to ensure the PC remains unchanged.
        //
        // This is to keep the same behavior with Unicorn1, though, it's inconsistent with
        // official arm documents.
        //
        // See discussion here: https://github.com/unicorn-engine/unicorn/issues/1536
        if (dc->uc->invalid_error) {
            dcbase->is_jmp = DISAS_WFI;
            return;
        }

        dc->base.pc_next += 4;
        disas_arm_insn(dc, insn);

        arm_post_translate_insn(dc);

        /* ARM is a fixed-length ISA.  We performed the cross-page check
           in init_disas_context by adjusting max_insns.  */
    }
}